

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Gym_Emu::load_mem_(Gym_Emu *this,byte_ *in,long size)

{
  uint in_EAX;
  blargg_err_t pcVar1;
  int offset;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  pcVar1 = check_header(in,size,(int *)((long)&uStack_28 + 4));
  if (pcVar1 == (blargg_err_t)0x0) {
    (this->super_Music_Emu).voice_count_ = 8;
    this->loop_begin = (byte *)0x0;
    this->data = in + uStack_28._4_4_;
    this->data_end = in + size;
    if ((long)uStack_28._4_4_ == 0) {
      memset(&this->header_,0,0x1ac);
    }
    else {
      memcpy(&this->header_,in,0x1ac);
    }
  }
  return pcVar1;
}

Assistant:

blargg_err_t Gym_Emu::load_mem_( byte const* in, long size )
{
	assert( offsetof (header_t,packed [4]) == header_size );
	int offset = 0;
	RETURN_ERR( check_header( in, size, &offset ) );
	set_voice_count( 8 );
	
	data     = in + offset;
	data_end = in + size;
	loop_begin = 0;
	
	if ( offset )
		header_ = *(header_t const*) in;
	else
		memset( &header_, 0, sizeof header_ );
	
	return 0;
}